

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NullStoreTestCase.cpp
# Opt level: O0

void __thiscall
SuiteNullStoreTests::TestsetGetWithQuote::~TestsetGetWithQuote(TestsetGetWithQuote *this)

{
  TestsetGetWithQuote *this_local;
  
  ~TestsetGetWithQuote(this);
  operator_delete(this,0x38);
  return;
}

Assistant:

TEST( setGetWithQuote )
{
  NullStore object;

  ExecutionReport singleQuote;
  singleQuote.setField( Text("Some Text") );
  object.set( 1, singleQuote.toString() );

  ExecutionReport doubleQuote;
  doubleQuote.setField( Text("\"Some Text\"") );
  object.set( 2, doubleQuote.toString() );

  ExecutionReport bothQuote;
  bothQuote.setField( Text("'\"Some Text\"'") );
  object.set( 3, bothQuote.toString() );

  ExecutionReport escape;
  escape.setField( Text("\\Some Text\\") );
  object.set( 4, escape.toString() );

  std::vector < std::string > messages;
  object.get( 1, 4, messages );
  CHECK_EQUAL( 0U, messages.size() );
}